

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ModelPtr __thiscall libcellml::Parser::ParserImpl::parseModel(ParserImpl *this,string *input)

{
  IssueImpl *this_00;
  ulong uVar1;
  element_type *peVar2;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ModelPtr MVar4;
  shared_ptr<libcellml::Model> local_80;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  IssuePtr issue;
  string *input_local;
  ParserImpl *this_local;
  ModelPtr *model;
  
  Logger::LoggerImpl::removeAllIssues((LoggerImpl *)input);
  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0
  ;
  std::shared_ptr<libcellml::Model>::shared_ptr((shared_ptr<libcellml::Model> *)this,(nullptr_t)0x0)
  ;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Model::create();
    std::shared_ptr<libcellml::Model>::operator=((shared_ptr<libcellml::Model> *)this,&local_80);
    std::shared_ptr<libcellml::Model>::~shared_ptr(&local_80);
    loadModel((ParserImpl *)input,(ModelPtr *)this,in_RDX);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    Issue::IssueImpl::create();
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    this_00 = peVar2->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Model string is empty.",&local_69);
    Issue::IssueImpl::setDescription(this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    Issue::IssueImpl::setReferenceRule(peVar2->mPimpl,XML);
    Logger::LoggerImpl::addIssue((LoggerImpl *)input,(IssuePtr *)local_38);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_38);
    _Var3._M_pi = extraout_RDX;
  }
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Parser::ParserImpl::parseModel(const std::string &input)
{
    removeAllIssues();
    ModelPtr model = nullptr;
    if (input.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Model string is empty.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
        addIssue(issue);
    } else {
        model = Model::create();
        loadModel(model, input);
    }
    return model;
}